

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O0

void testReadDeep(string *tempdir)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference piVar9;
  string *in_RDI;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  int *c_1;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  size_t bps;
  size_t N;
  uint32_t *sampcount;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exception *e;
  DeepScanLineInputFile file;
  int cp;
  int c;
  exr_chunk_info_t cinfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampdata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packed;
  Compression comps [3];
  int chancounts [4];
  exr_context_initializer_t cinit;
  exr_context_t f;
  string fn;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbf8;
  ostream *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  ostream *in_stack_fffffffffffffc10;
  ostream *in_stack_fffffffffffffc18;
  ostream *in_stack_fffffffffffffc20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  undefined1 *local_198;
  long local_190;
  ulong local_188;
  uchar *local_180;
  int local_174;
  int local_170;
  int local_16c;
  DeepScanLineInputFile local_160 [32];
  int local_140;
  int local_13c;
  vector<int,_std::allocator<int>_> local_138 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  int local_c4 [11];
  undefined8 local_98;
  code *pcStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,in_RDI);
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_38 = 0;
  local_98 = 0x68;
  uStack_40 = 0xbf800000fffffffe;
  pcStack_90 = anon_unknown.dwarf_2effe::err_cb;
  std::__cxx11::string::operator+=(local_28,"randomtempdeep.exr");
  local_c4[3] = 1;
  local_c4[4] = 3;
  local_c4[5] = 10;
  local_c4[6] = 0;
  local_c4[0] = 0;
  local_c4[1] = 1;
  local_c4[2] = 2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12d2c9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12d2d6);
  local_13c = 0;
  while (0 < local_c4[(long)local_13c + 3]) {
    for (local_140 = 0; local_140 < 3; local_140 = local_140 + 1) {
      anon_unknown.dwarf_2effe::generateRandomScanFile((string *)e,_test_rv,_test_rv_1);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile(local_160,pcVar3,8);
      Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile
                ((DeepScanLineInputFile *)in_stack_fffffffffffffc00);
      uVar4 = std::__cxx11::string::c_str();
      local_16c = exr_start_read(&local_30,uVar4,&local_98);
      if (local_16c != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_16c);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(local_16c);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      local_170 = exr_read_scanline_chunk_info(local_30,0,0x5f,local_138);
      if (local_170 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_170);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(local_170);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      uVar4 = local_30;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_e0,0);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_f8,0);
      local_174 = exr_read_deep_chunk(uVar4,0,local_138,pvVar6,pvVar7);
      if (local_174 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_174);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(local_174);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      if (local_c4[local_140] == 0) {
        local_180 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12d833);
        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_f8);
        local_188 = sVar8 >> 2;
        if (local_188 != 0x111) {
          core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                         (char *)in_stack_fffffffffffffbf8);
        }
        local_190 = 0;
        local_198 = (anonymous_namespace)::channelTypes;
        local_1a0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffbf8);
        std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffbf8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffc00,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffbf8), bVar1) {
          piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_1a0);
          if (*piVar9 == 0) {
            local_190 = local_190 + 4;
          }
          if (*piVar9 == 1) {
            local_190 = local_190 + 2;
          }
          if (*piVar9 == 2) {
            local_190 = local_190 + 4;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_1a0);
        }
        sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_e0);
        if (sVar8 != (ulong)*(uint *)(local_180 + (local_188 - 1) * 4) * local_190) {
          core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                         (char *)in_stack_fffffffffffffbf8);
        }
      }
      iVar2 = exr_read_scanline_chunk_info(local_30,0,0x35,local_138);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      uVar4 = local_30;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_e0,0);
      iVar2 = exr_read_deep_chunk(uVar4,0,local_138,pvVar6,0);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      uVar4 = local_30;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_f8,0);
      iVar2 = exr_read_deep_chunk(uVar4,0,local_138,0,pvVar6);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      exr_finish(&local_30);
      anon_unknown.dwarf_2effe::generateRandomTileFile
                ((string *)
                 sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,cinfo.sample_count_table_size._4_4_,
                 (Compression)cinfo.sample_count_table_size);
      uVar4 = std::__cxx11::string::c_str();
      iVar2 = exr_start_read(&local_30,uVar4,&local_98);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      in_stack_fffffffffffffbf8 = local_138;
      iVar2 = exr_read_tile_chunk_info(local_30,0,0,1,0);
      if (iVar2 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
        poVar5 = std::operator<<(poVar5,") ");
        pcVar3 = (char *)exr_get_default_error_message(iVar2);
        poVar5 = std::operator<<(poVar5,pcVar3);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc20,
                 (size_type)in_stack_fffffffffffffc18);
      uVar4 = local_30;
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_e0,0);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_f8,0);
      iVar2 = exr_read_deep_chunk(uVar4,0,local_138,pvVar6,pvVar7);
      if (iVar2 != 0) {
        in_stack_fffffffffffffc20 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        in_stack_fffffffffffffc18 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc20,iVar2);
        in_stack_fffffffffffffc10 = std::operator<<(in_stack_fffffffffffffc18,") ");
        in_stack_fffffffffffffc08 = (char *)exr_get_default_error_message(iVar2);
        in_stack_fffffffffffffc00 =
             std::operator<<(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        std::ostream::operator<<(in_stack_fffffffffffffc00,std::endl<char,std::char_traits<char>>);
        core_test_fail((char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                       (uint)((ulong)in_stack_fffffffffffffc00 >> 0x20),
                       (char *)in_stack_fffffffffffffbf8);
      }
      exr_finish(&local_30);
    }
    local_13c = local_13c + 1;
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  remove(pcVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc10);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testReadDeep (const std::string& tempdir)
{
    std::string fn = tempdir;

    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "randomtempdeep.exr";

    int         chancounts[] = {1, 3, 10, 0};
    Compression comps[] = {NO_COMPRESSION, RLE_COMPRESSION, ZIPS_COMPRESSION};
    std::vector<uint8_t> packed;
    std::vector<uint8_t> sampdata;
    exr_chunk_info_t     cinfo;

    for (int c = 0; chancounts[c] > 0; ++c)
    {
        for (int cp = 0; cp < 3; ++cp)
        {
            generateRandomScanFile (fn, chancounts[c], comps[cp]);
            try
            {
                DeepScanLineInputFile file (fn.c_str (), 8);
            }
            catch (std::exception& e)
            {
                std::cerr << "ERROR: c++ unable to open generated deep scane"
                          << e.what () << std::endl;
            }

            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

            EXRCORE_TEST_RVAL (
                exr_read_scanline_chunk_info (f, 0, minY + height / 2, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0]));
            if (comps[cp] == NO_COMPRESSION)
            {
                const uint32_t* sampcount =
                    reinterpret_cast<const uint32_t*> (sampdata.data ());
                size_t N = sampdata.size () / sizeof (uint32_t);
                EXRCORE_TEST (N == width);
                size_t bps = 0;
                for (auto& c: channelTypes)
                {
                    if (c == 0) bps += sizeof (uint32_t);
                    if (c == 1) bps += sizeof (uint16_t);
                    if (c == 2) bps += sizeof (float);
                }
                EXRCORE_TEST (packed.size () == (sampcount[N - 1]) * bps);
            }

            EXRCORE_TEST_RVAL (
                exr_read_scanline_chunk_info (f, 0, minY + height / 4, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            // we support reading the two bits separately
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], NULL));
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, NULL, &sampdata[0]));

            exr_finish (&f);

            generateRandomTileFile (fn, chancounts[c], comps[cp]);
            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, 0, 1, 0, 0, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0]));

            exr_finish (&f);
        }
    }
    remove (fn.c_str ());
}